

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_still_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  uint __val;
  float fVar6;
  float fVar7;
  string __str;
  Mat image;
  long *local_168 [2];
  long local_158 [2];
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  _InputArray local_e8;
  string local_d0;
  string local_b0;
  Mat local_90 [96];
  
  usage();
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"-w","");
  fVar6 = getParamVal(&local_b0,argc,argv,2592.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"-h","");
  fVar7 = getParamVal(&local_d0,argc,argv,1944.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing ...",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)fVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,(int)fVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  raspicam::RaspiCam_Still_Cv::set(0x105108,(double)(int)fVar6);
  raspicam::RaspiCam_Still_Cv::set(0x105108,(double)(int)fVar7);
  raspicam::RaspiCam_Still_Cv::open();
  cv::Mat::Mat(local_90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"capturing",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  __val = 0;
  do {
    cVar1 = raspicam::RaspiCam_Still_Cv::grab();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in grab",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
      std::ostream::put('p');
      iVar5 = -1;
      std::ostream::flush();
      goto LAB_0010284f;
    }
    raspicam::RaspiCam_Still_Cv::retrieve((Mat *)Camera);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"saving picture",0xe);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,__val);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".jpg",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct((ulong)local_168,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_168[0],1,__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x1030b8);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_138 = *plVar4;
      lStack_130 = plVar3[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar4;
      local_148 = (long *)*plVar3;
    }
    local_140 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_148);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*plVar3;
    }
    local_120 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_e8.sz.width = 0;
    local_e8.sz.height = 0;
    local_e8.flags = 0x1010000;
    local_e8.obj = local_90;
    local_f8 = 0;
    local_108 = (void *)0x0;
    uStack_100 = 0;
    cv::imwrite((string *)&local_128,&local_e8,(vector *)&local_108);
    if (local_108 != (void *)0x0) {
      operator_delete(local_108,local_f8 - (long)local_108);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    __val = __val + 1;
  } while (__val != 5);
  iVar5 = 0;
LAB_0010284f:
  cv::Mat::~Mat(local_90);
  return iVar5;
}

Assistant:

int main ( int argc, char *argv[] ) {
    usage();

    int width = getParamVal ( "-w",argc,argv,2592 );//define width
    int height =getParamVal ( "-h",argc,argv,1944 );//define height
    cout << "Initializing ..."<<width<<"x"<<height<<endl;
    Camera.set ( CV_CAP_PROP_FRAME_WIDTH, width );
    Camera.set ( CV_CAP_PROP_FRAME_HEIGHT, height );
    Camera.open();
    cv::Mat image;
    cout<<"capturing"<<endl;
    for(int i=0;i<5;i++){
        if ( !Camera.grab ( ) ) {
            cerr<<"Error in grab"<<endl;
            return -1;
        }
        Camera.retrieve ( image );
        cout<<"saving picture"<<i<<".jpg"<<endl;
        cv::imwrite ( "picture-"+std::to_string(i)+".jpg",image );
    }
    return 0;
}